

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O2

DVector3 * __thiscall
AActor::Vec2OffsetZ(DVector3 *__return_storage_ptr__,AActor *this,double dx,double dy,double atz,
                   bool absolute)

{
  undefined1 auVar1 [16];
  undefined3 in_register_00000011;
  DVector2 v;
  double local_28;
  double dStack_20;
  
  if (CONCAT31(in_register_00000011,absolute) == 0) {
    P_GetOffsetPosition((this->__Pos).X,(this->__Pos).Y,dx,dy);
  }
  else {
    local_28 = dx + (this->__Pos).X;
    dStack_20 = dy + (this->__Pos).Y;
  }
  auVar1._8_4_ = SUB84(dStack_20,0);
  auVar1._0_8_ = local_28;
  auVar1._12_4_ = (int)((ulong)dStack_20 >> 0x20);
  __return_storage_ptr__->X = local_28;
  __return_storage_ptr__->Y = (double)auVar1._8_8_;
  __return_storage_ptr__->Z = atz;
  return __return_storage_ptr__;
}

Assistant:

DVector3 Vec2OffsetZ(double dx, double dy, double atz, bool absolute = false)
	{
		if (absolute)
		{
			return{ X() + dx, Y() + dy, atz };
		}
		else
		{
			DVector2 v = P_GetOffsetPosition(X(), Y(), dx, dy);
			return DVector3(v, atz);
		}
	}